

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

void __thiscall MeCab::Writer::Writer(Writer *this)

{
  undefined8 *in_RDI;
  whatlog *this_00;
  scoped_string *this_01;
  
  *in_RDI = &PTR__Writer_00189d60;
  this_01 = (scoped_string *)(in_RDI + 1);
  scoped_string::scoped_string(this_01);
  scoped_string::scoped_string(this_01);
  scoped_string::scoped_string(this_01);
  this_00 = (whatlog *)(in_RDI + 7);
  scoped_string::scoped_string(this_01);
  scoped_string::scoped_string(this_01);
  whatlog::whatlog(this_00);
  in_RDI[0x3e] = writeLattice;
  in_RDI[0x3f] = 0;
  return;
}

Assistant:

Writer::Writer() : write_(&Writer::writeLattice) {}